

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindBoundPivot(Binder *this,PivotRef *ref)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *aggregates;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var1;
  undefined8 *puVar2;
  Value *pVVar3;
  long lVar4;
  long lVar5;
  _Head_base<0UL,_duckdb::BoundPivotRef_*,_false> _Var6;
  _Alloc_hider _Var7;
  idx_t iVar8;
  pointer pBVar9;
  Binder *pBVar10;
  pointer pBVar11;
  type node;
  reference pvVar12;
  reference __x;
  reference this_00;
  pointer pEVar13;
  type other;
  InternalException *this_01;
  undefined8 *puVar14;
  long in_RDX;
  pointer *__ptr;
  idx_t i;
  ulong uVar15;
  Value *this_02;
  _Head_base<0UL,_duckdb::BoundPivotRef_*,_false> local_188;
  long local_180;
  string subquery_alias;
  string pivot_str;
  vector<duckdb::LogicalType,_true> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::LogicalType,_true> child_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  child_names;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  make_uniq<duckdb::BoundPivotRef>();
  iVar8 = GenerateTableIndex((Binder *)ref);
  pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
           operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                       *)&local_188);
  pBVar9->bind_index = iVar8;
  CreateBinder((Binder *)&subquery_alias,
               (ClientContext *)(ref->super_TableRef).alias._M_dataplus._M_p,
               (optional_ptr<duckdb::Binder,_true>)ref,REGULAR_BINDER);
  pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
           operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                       *)&local_188);
  shared_ptr<duckdb::Binder,_true>::operator=
            (&pBVar9->child_binder,(shared_ptr<duckdb::Binder,_true> *)&subquery_alias);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&subquery_alias._M_string_length);
  pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
           operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                       *)&local_188);
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar9->child_binder);
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             (in_RDX + 0x68));
  Bind((Binder *)&subquery_alias,(TableRef *)pBVar10);
  pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
           operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                       *)&local_188);
  _Var7 = subquery_alias._M_dataplus;
  subquery_alias._M_dataplus._M_p = (pointer)0x0;
  _Var1._M_head_impl =
       (pBVar9->child).
       super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
       super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl;
  (pBVar9->child).
  super_unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>.
  super__Head_base<0UL,_duckdb::BoundTableRef_*,_false>._M_head_impl = (BoundTableRef *)_Var7._M_p;
  if (_Var1._M_head_impl != (BoundTableRef *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_BoundTableRef + 8))();
    if (subquery_alias._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)subquery_alias._M_dataplus._M_p + 8))();
    }
  }
  pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
           operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                       *)&local_188);
  pBVar11 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
            operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                        *)&local_188);
  node = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
         operator*(&pBVar11->child);
  aggregates = &(pBVar9->bound_pivot).aggregates;
  ExtractPivotAggregates(node,aggregates);
  local_180 = in_RDX;
  if ((long)(pBVar9->bound_pivot).aggregates.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(pBVar9->bound_pivot).aggregates.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 ==
      *(long *)(in_RDX + 0x110) - *(long *)(in_RDX + 0x108) >> 5) {
    child_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    child_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    child_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    child_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    child_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    child_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pBVar11 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
              operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                          *)&local_188);
    pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar11->child_binder);
    BindContext::GetTypesAndNames(&pBVar10->bind_context,&child_names,&child_types);
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar15 = 0;
        uVar15 < (ulong)(*(long *)(local_180 + 0xf8) - *(long *)(local_180 + 0xf0) >> 5);
        uVar15 = uVar15 + 1) {
      pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)(in_RDX + 0xf0),uVar15);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&names,pvVar12);
      __x = vector<duckdb::LogicalType,_true>::get<true>(&child_types,uVar15);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x)
      ;
    }
    puVar2 = *(undefined8 **)(local_180 + 0xe0);
    for (puVar14 = *(undefined8 **)(local_180 + 0xd8); puVar14 != puVar2; puVar14 = puVar14 + 7) {
      for (uVar15 = 0;
          uVar15 < (ulong)(*(long *)(local_180 + 0x110) - *(long *)(local_180 + 0x108) >> 5);
          uVar15 = uVar15 + 1) {
        this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::get<true>(aggregates,uVar15);
        pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)(in_RDX + 0x108),uVar15);
        ::std::__cxx11::string::string((string *)&subquery_alias,(string *)(puVar14 + 3));
        if ((8 < (ulong)((long)(pBVar9->bound_pivot).aggregates.
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pBVar9->bound_pivot).aggregates.
                              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) ||
           (pvVar12->_M_string_length != 0)) {
          if (pvVar12->_M_string_length == 0) {
            pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(this_00);
            (*(pEVar13->super_BaseExpression)._vptr_BaseExpression[7])(&str,pEVar13);
          }
          else {
            ::std::__cxx11::string::string((string *)&str,(string *)pvVar12);
          }
          ::std::operator+(&pivot_str,"_",&str);
          ::std::__cxx11::string::append((string *)&subquery_alias);
          ::std::__cxx11::string::~string((string *)&pivot_str);
          ::std::__cxx11::string::~string((string *)&str);
        }
        pivot_str._M_dataplus._M_p = (pointer)&pivot_str.field_2;
        pivot_str._M_string_length = 0;
        pivot_str.field_2._M_local_buf[0] = '\0';
        pVVar3 = (Value *)puVar14[1];
        for (this_02 = (Value *)*puVar14; this_02 != pVVar3; this_02 = this_02 + 1) {
          Value::ToString_abi_cxx11_(&str,this_02);
          if (pivot_str._M_string_length == 0) {
            ::std::__cxx11::string::operator=((string *)&pivot_str,(string *)&str);
          }
          else {
            ::std::operator+(&local_50,"_",&str);
            ::std::__cxx11::string::append((string *)&pivot_str);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
          ::std::__cxx11::string::~string((string *)&str);
        }
        pBVar11 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                  ::operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                                *)&local_188);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(pBVar11->bound_pivot).pivot_values,&pivot_str);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&names,
                   &subquery_alias);
        pEVar13 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_00);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &pEVar13->return_type);
        ::std::__cxx11::string::~string((string *)&pivot_str);
        ::std::__cxx11::string::~string((string *)&subquery_alias);
      }
    }
    lVar4 = *(long *)(local_180 + 0xf0);
    lVar5 = *(long *)(local_180 + 0xf8);
    pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
             operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                         *)&local_188);
    (pBVar9->bound_pivot).group_count = lVar5 - lVar4 >> 5;
    pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
             operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                         *)&local_188);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pBVar9->bound_pivot).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    if (*(long *)(local_180 + 0x18) == 0) {
      ::std::__cxx11::string::string
                ((string *)&subquery_alias,"__unnamed_pivot",(allocator *)&pivot_str);
    }
    else {
      ::std::__cxx11::string::string((string *)&subquery_alias,(string *)(local_180 + 0x10));
    }
    QueryResult::DeduplicateColumns(&names);
    pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
             operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                         *)&local_188);
    BindContext::AddGenericBinding
              ((BindContext *)&ref->unpivot_names,pBVar9->bind_index,&subquery_alias,&names,&types);
    pBVar9 = unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>::
             operator->((unique_ptr<duckdb::BoundPivotRef,_std::default_delete<duckdb::BoundPivotRef>,_true>
                         *)&local_188);
    other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar9->child_binder);
    MoveCorrelatedExpressions((Binder *)ref,other);
    _Var6._M_head_impl = local_188._M_head_impl;
    local_188._M_head_impl = (BoundPivotRef *)0x0;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var6._M_head_impl;
    ::std::__cxx11::string::~string((string *)&subquery_alias);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&names);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&child_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
    ;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&child_names);
    if (local_188._M_head_impl != (BoundPivotRef *)0x0) {
      (*((local_188._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef[1])();
    }
    return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
           (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&subquery_alias,"Pivot aggregate count mismatch (expected %llu, found %llu)",
             (allocator *)&pivot_str);
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_01,&subquery_alias,
             *(long *)(local_180 + 0x110) - *(long *)(local_180 + 0x108) >> 5,
             (long)(pBVar9->bound_pivot).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar9->bound_pivot).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindBoundPivot(PivotRef &ref) {
	// bind the child table in a child binder
	auto result = make_uniq<BoundPivotRef>();
	result->bind_index = GenerateTableIndex();
	result->child_binder = Binder::CreateBinder(context, this);
	result->child = result->child_binder->Bind(*ref.source);

	auto &aggregates = result->bound_pivot.aggregates;
	ExtractPivotAggregates(*result->child, aggregates);
	if (aggregates.size() != ref.bound_aggregate_names.size()) {
		throw InternalException("Pivot aggregate count mismatch (expected %llu, found %llu)",
		                        ref.bound_aggregate_names.size(), aggregates.size());
	}

	vector<string> child_names;
	vector<LogicalType> child_types;
	result->child_binder->bind_context.GetTypesAndNames(child_names, child_types);

	vector<string> names;
	vector<LogicalType> types;
	// emit the groups
	for (idx_t i = 0; i < ref.bound_group_names.size(); i++) {
		names.push_back(ref.bound_group_names[i]);
		types.push_back(child_types[i]);
	}
	// emit the pivot columns
	for (auto &pivot_value : ref.bound_pivot_values) {
		for (idx_t aggr_idx = 0; aggr_idx < ref.bound_aggregate_names.size(); aggr_idx++) {
			auto &aggr = aggregates[aggr_idx];
			auto &aggr_name = ref.bound_aggregate_names[aggr_idx];
			auto name = pivot_value.name;
			if (aggregates.size() > 1 || !aggr_name.empty()) {
				// if there are multiple aggregates specified we add the name of the aggregate as well
				name += "_" + (aggr_name.empty() ? aggr->GetName() : aggr_name);
			}
			string pivot_str;
			for (auto &value : pivot_value.values) {
				auto str = value.ToString();
				if (pivot_str.empty()) {
					pivot_str = std::move(str);
				} else {
					pivot_str += "_" + str;
				}
			}
			result->bound_pivot.pivot_values.push_back(std::move(pivot_str));
			names.push_back(std::move(name));
			types.push_back(aggr->return_type);
		}
	}
	result->bound_pivot.group_count = ref.bound_group_names.size();
	result->bound_pivot.types = types;
	auto subquery_alias = ref.alias.empty() ? "__unnamed_pivot" : ref.alias;
	QueryResult::DeduplicateColumns(names);
	bind_context.AddGenericBinding(result->bind_index, subquery_alias, names, types);

	MoveCorrelatedExpressions(*result->child_binder);
	return std::move(result);
}